

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PinHole.cpp
# Opt level: O3

Vector3 __thiscall pm::PinHole::rayDirection(PinHole *this,float x,float y)

{
  float fVar1;
  long in_RSI;
  Vector3 *dir;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float fVar4;
  Vector3 VVar5;
  
  fVar1 = *(float *)(in_RSI + 0x58);
  fVar4 = (*(float *)(in_RSI + 0x44) * y + *(float *)(in_RSI + 0x38) * x) -
          *(float *)(in_RSI + 0x50) * fVar1;
  auVar2._0_4_ = (y * (float)*(undefined8 *)(in_RSI + 0x3c) +
                 (float)*(undefined8 *)(in_RSI + 0x30) * x) - fVar1 * *(float *)(in_RSI + 0x48);
  auVar2._4_4_ = (y * (float)((ulong)*(undefined8 *)(in_RSI + 0x3c) >> 0x20) +
                 (float)((ulong)*(undefined8 *)(in_RSI + 0x30) >> 0x20) * x) -
                 *(float *)(in_RSI + 0x4c) * fVar1;
  auVar2._8_4_ = (y * 0.0 + x * 0.0) - *(float *)(in_RSI + 0x50) * 0.0;
  auVar2._12_4_ = (y * 0.0 + x * 0.0) - *(float *)(in_RSI + 0x54) * 0.0;
  VVar5.x = SQRT(fVar4 * fVar4 + auVar2._0_4_ * auVar2._0_4_ + auVar2._4_4_ * auVar2._4_4_);
  auVar3._4_4_ = VVar5.x;
  auVar3._0_4_ = VVar5.x;
  auVar3._8_8_ = 0;
  auVar3 = divps(auVar2,auVar3);
  (this->super_Camera)._vptr_Camera = auVar3._0_8_;
  (this->super_Camera).type_ = (Type)(fVar4 / VVar5.x);
  VVar5.y = VVar5.x;
  VVar5.z = auVar3._0_4_;
  return VVar5;
}

Assistant:

Vector3 PinHole::rayDirection(float x, float y) const
{
	Vector3 dir = x * u_ + y * v_ - distance_ * w_;
	dir.normalize();

	return dir;
}